

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::CreateDeath(CGameContext *this,vec2 Pos,int ClientID)

{
  undefined8 *puVar1;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_18;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_14;
  
  puVar1 = (undefined8 *)CEventHandler::Create(&this->m_Events,0x14,0xc,-1);
  if (puVar1 != (undefined8 *)0x0) {
    local_18 = Pos.field_0;
    aStack_14 = Pos.field_1;
    *puVar1 = CONCAT44((int)aStack_14.y,(int)local_18.x);
    *(int *)(puVar1 + 1) = ClientID;
  }
  return;
}

Assistant:

void CGameContext::CreateDeath(vec2 Pos, int ClientID)
{
	// create the event
	CNetEvent_Death *pEvent = (CNetEvent_Death *)m_Events.Create(NETEVENTTYPE_DEATH, sizeof(CNetEvent_Death));
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_ClientID = ClientID;
	}
}